

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UnicodeSet * icu_63::getInclusionsForSource(UPropertySource src,UErrorCode *errorCode)

{
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (src < UPROPS_SRC_COUNT) {
      umtx_initOnce<UPropertySource>
                ((UInitOnce *)(&DAT_003fd958 + (ulong)src * 4),CharacterProperties::initInclusion,
                 src,errorCode);
      return (UnicodeSet *)(&::(anonymous_namespace)::gInclusions)[(ulong)src * 2];
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (UnicodeSet *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }